

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O1

wchar_t archive_acl_text_l(archive_acl *acl,wchar_t flags,char **acl_text,size_t *acl_text_len,
                          archive_string_conv *sc)

{
  char *pcVar1;
  uint uVar2;
  long lVar3;
  size_t *psVar4;
  archive_acl *paVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  char *pcVar8;
  size_t sVar9;
  char cVar10;
  size_t sVar11;
  archive_acl_entry *paVar13;
  int iVar14;
  char *p;
  char *name;
  size_t len;
  char *local_68;
  char *local_60;
  archive_string_conv *local_58;
  size_t local_50;
  char **local_48;
  size_t *local_40;
  archive_acl *local_38;
  long lVar12;
  
  local_58 = sc;
  if (acl->acl_text != (char *)0x0) {
    free(acl->acl_text);
    acl->acl_text = (char *)0x0;
  }
  *acl_text = (char *)0x0;
  if (acl_text_len != (size_t *)0x0) {
    *acl_text_len = 0;
  }
  paVar13 = acl->acl_head;
  local_48 = acl_text;
  local_40 = acl_text_len;
  local_38 = acl;
  if (paVar13 == (archive_acl_entry *)0x0) {
    iVar14 = 0;
    sVar11 = 0;
  }
  else {
    sVar11 = 0;
    iVar14 = 0;
    do {
      wVar7 = paVar13->type;
      if ((wVar7 & flags) != 0) {
        wVar6 = archive_mstring_get_mbs_l(&paVar13->name,&local_60,&local_50,local_58);
        if (wVar6 != L'\0') {
          return L'\xffffffff';
        }
        sVar9 = sVar11 + 8;
        if (((uint)wVar7 >> 9 & 1) == 0) {
          sVar9 = sVar11;
        }
        if (((uint)flags >> 0xb & 1) == 0) {
          sVar9 = sVar11;
        }
        iVar14 = iVar14 + 1;
        lVar12 = sVar9 + 6 + local_50;
        if (local_60 == (char *)0x0) {
          lVar12 = sVar9 + 0x13;
        }
        if (local_50 == 0) {
          lVar12 = sVar9 + 0x13;
        }
        sVar11 = lVar12 + 0x13;
      }
      paVar13 = paVar13->next;
    } while (paVar13 != (archive_acl_entry *)0x0);
  }
  if (iVar14 != 0) {
    sVar9 = sVar11 + 0x20;
    if (iVar14 < 1) {
      sVar9 = sVar11;
    }
    if (((uint)flags >> 8 & 1) == 0) {
      sVar9 = sVar11;
    }
    pcVar8 = (char *)malloc(sVar9);
    paVar5 = local_38;
    local_38->acl_text = pcVar8;
    if (pcVar8 == (char *)0x0) {
      return L'\xffffffff';
    }
    local_68 = pcVar8;
    if (((uint)flags >> 8 & 1) != 0) {
      uVar2 = local_38->mode;
      builtin_strncpy(pcVar8,"user",5);
      sVar11 = strlen(pcVar8);
      pcVar8[sVar11] = ':';
      pcVar8[sVar11 + 1] = ':';
      cVar10 = 'r';
      if ((uVar2 >> 8 & 1) == 0) {
        cVar10 = '-';
      }
      pcVar8[sVar11 + 2] = cVar10;
      cVar10 = 'w';
      if (-1 < (char)uVar2) {
        cVar10 = '-';
      }
      pcVar8[sVar11 + 3] = cVar10;
      cVar10 = 'x';
      if ((uVar2 & 0x40) == 0) {
        cVar10 = '-';
      }
      pcVar8[sVar11 + 4] = cVar10;
      pcVar8[sVar11 + 5] = '\0';
      local_68 = pcVar8 + sVar11 + 6;
      pcVar8[sVar11 + 5] = ',';
      pcVar1 = pcVar8 + sVar11 + 6;
      pcVar1[0] = 'g';
      pcVar1[1] = 'r';
      pcVar1[2] = 'o';
      pcVar1[3] = 'u';
      (pcVar8 + sVar11 + 10)[0] = 'p';
      (pcVar8 + sVar11 + 10)[1] = '\0';
      sVar9 = strlen(local_68);
      lVar12 = sVar9 + sVar11 + 6;
      pcVar8[sVar9 + sVar11 + 6] = ':';
      pcVar8[sVar9 + sVar11 + 7] = ':';
      cVar10 = 'r';
      if ((uVar2 & 0x20) == 0) {
        cVar10 = '-';
      }
      pcVar8[sVar9 + sVar11 + 8] = cVar10;
      cVar10 = 'w';
      if ((uVar2 & 0x10) == 0) {
        cVar10 = '-';
      }
      pcVar8[sVar9 + sVar11 + 9] = cVar10;
      cVar10 = 'x';
      if ((uVar2 & 8) == 0) {
        cVar10 = '-';
      }
      pcVar8[sVar9 + sVar11 + 10] = cVar10;
      pcVar8[sVar9 + sVar11 + 0xb] = '\0';
      lVar3 = sVar9 + sVar11;
      local_68 = pcVar8 + lVar3 + 0xc;
      pcVar8[lVar3 + 0xb] = ',';
      uVar2 = paVar5->mode;
      local_68[0] = 'o';
      local_68[1] = 't';
      local_68[2] = 'h';
      local_68[3] = 'e';
      (pcVar8 + lVar3 + 0x10)[0] = 'r';
      (pcVar8 + lVar3 + 0x10)[1] = '\0';
      sVar11 = strlen(local_68);
      pcVar8[sVar11 + lVar12 + 6] = ':';
      pcVar8[sVar11 + lVar12 + 7] = ':';
      cVar10 = 'r';
      if ((uVar2 & 4) == 0) {
        cVar10 = '-';
      }
      pcVar8[sVar11 + lVar12 + 8] = cVar10;
      cVar10 = 'w';
      if ((uVar2 & 2) == 0) {
        cVar10 = '-';
      }
      pcVar8[sVar11 + lVar12 + 9] = cVar10;
      cVar10 = 'x';
      if ((uVar2 & 1) == 0) {
        cVar10 = '-';
      }
      local_68 = pcVar8 + sVar11 + lVar12 + 0xb;
      pcVar8[sVar11 + lVar12 + 10] = cVar10;
      *local_68 = '\0';
      paVar13 = paVar5->acl_head;
      if (paVar13 != (archive_acl_entry *)0x0) {
        do {
          if ((paVar13->type & L'Ā') != L'\0') {
            wVar7 = archive_mstring_get_mbs_l(&paVar13->name,&local_60,&local_50,local_58);
            if (wVar7 != L'\0') {
              return L'\xffffffff';
            }
            *local_68 = ',';
            wVar7 = L'\xffffffff';
            if (((uint)flags >> 10 & 1) != 0) {
              wVar7 = paVar13->id;
            }
            local_68 = local_68 + 1;
            append_entry(&local_68,(char *)0x0,paVar13->tag,local_60,paVar13->permset,wVar7);
          }
          paVar13 = paVar13->next;
        } while (paVar13 != (archive_acl_entry *)0x0);
      }
    }
    if (((uint)flags >> 9 & 1) != 0) {
      iVar14 = 0;
      pcVar8 = (char *)0x0;
      if (((uint)flags >> 0xb & 1) != 0) {
        pcVar8 = "default:";
      }
      paVar13 = paVar5->acl_head;
      if (paVar13 != (archive_acl_entry *)0x0) {
        do {
          if ((paVar13->type & L'Ȁ') != L'\0') {
            wVar7 = archive_mstring_get_mbs_l(&paVar13->name,&local_60,&local_50,local_58);
            if (wVar7 != L'\0') {
              return L'\xffffffff';
            }
            if (0 < iVar14) {
              *local_68 = ',';
              local_68 = local_68 + 1;
            }
            wVar7 = L'\xffffffff';
            if (((uint)flags >> 10 & 1) != 0) {
              wVar7 = paVar13->id;
            }
            append_entry(&local_68,pcVar8,paVar13->tag,local_60,paVar13->permset,wVar7);
            iVar14 = iVar14 + 1;
          }
          paVar13 = paVar13->next;
        } while (paVar13 != (archive_acl_entry *)0x0);
      }
    }
    psVar4 = local_40;
    *local_48 = paVar5->acl_text;
    if (local_40 != (size_t *)0x0) {
      sVar11 = strlen(paVar5->acl_text);
      *psVar4 = sVar11;
    }
  }
  return L'\0';
}

Assistant:

int
archive_acl_text_l(struct archive_acl *acl, int flags,
    const char **acl_text, size_t *acl_text_len,
    struct archive_string_conv *sc)
{
	int count;
	size_t length;
	const char *name;
	const char *prefix;
	char separator;
	struct archive_acl_entry *ap;
	size_t len;
	int id, r;
	char *p;

	if (acl->acl_text != NULL) {
		free (acl->acl_text);
		acl->acl_text = NULL;
	}

	*acl_text = NULL;
	if (acl_text_len != NULL)
		*acl_text_len = 0;
	separator = ',';
	count = 0;
	length = 0;
	ap = acl->acl_head;
	while (ap != NULL) {
		if ((ap->type & flags) != 0) {
			count++;
			if ((flags & ARCHIVE_ENTRY_ACL_STYLE_MARK_DEFAULT) &&
			    (ap->type & ARCHIVE_ENTRY_ACL_TYPE_DEFAULT))
				length += 8; /* "default:" */
			length += 5; /* tag name */
			length += 1; /* colon */
			r = archive_mstring_get_mbs_l(
			    &ap->name, &name, &len, sc);
			if (r != 0)
				return (-1);
			if (len > 0 && name != NULL)
				length += len;
			else
				length += sizeof(uid_t) * 3 + 1;
			length ++; /* colon */
			length += 3; /* rwx */
			length += 1; /* colon */
			length += max(sizeof(uid_t), sizeof(gid_t)) * 3 + 1;
			length ++; /* newline */
		}
		ap = ap->next;
	}

	if (count > 0 && ((flags & ARCHIVE_ENTRY_ACL_TYPE_ACCESS) != 0)) {
		length += 10; /* "user::rwx\n" */
		length += 11; /* "group::rwx\n" */
		length += 11; /* "other::rwx\n" */
	}

	if (count == 0)
		return (0);

	/* Now, allocate the string and actually populate it. */
	p = acl->acl_text = (char *)malloc(length);
	if (p == NULL)
		return (-1);
	count = 0;
	if ((flags & ARCHIVE_ENTRY_ACL_TYPE_ACCESS) != 0) {
		append_entry(&p, NULL, ARCHIVE_ENTRY_ACL_USER_OBJ, NULL,
		    acl->mode & 0700, -1);
		*p++ = ',';
		append_entry(&p, NULL, ARCHIVE_ENTRY_ACL_GROUP_OBJ, NULL,
		    acl->mode & 0070, -1);
		*p++ = ',';
		append_entry(&p, NULL, ARCHIVE_ENTRY_ACL_OTHER, NULL,
		    acl->mode & 0007, -1);
		count += 3;

		for (ap = acl->acl_head; ap != NULL; ap = ap->next) {
			if ((ap->type & ARCHIVE_ENTRY_ACL_TYPE_ACCESS) == 0)
				continue;
			r = archive_mstring_get_mbs_l(
			    &ap->name, &name, &len, sc);
			if (r != 0)
				return (-1);
			*p++ = separator;
			if (flags & ARCHIVE_ENTRY_ACL_STYLE_EXTRA_ID)
				id = ap->id;
			else
				id = -1;
			append_entry(&p, NULL, ap->tag, name,
			    ap->permset, id);
			count++;
		}
	}


	if ((flags & ARCHIVE_ENTRY_ACL_TYPE_DEFAULT) != 0) {
		if (flags & ARCHIVE_ENTRY_ACL_STYLE_MARK_DEFAULT)
			prefix = "default:";
		else
			prefix = NULL;
		count = 0;
		for (ap = acl->acl_head; ap != NULL; ap = ap->next) {
			if ((ap->type & ARCHIVE_ENTRY_ACL_TYPE_DEFAULT) == 0)
				continue;
			r = archive_mstring_get_mbs_l(
			    &ap->name, &name, &len, sc);
			if (r != 0)
				return (-1);
			if (count > 0)
				*p++ = separator;
			if (flags & ARCHIVE_ENTRY_ACL_STYLE_EXTRA_ID)
				id = ap->id;
			else
				id = -1;
			append_entry(&p, prefix, ap->tag,
			    name, ap->permset, id);
			count ++;
		}
	}

	*acl_text = acl->acl_text;
	if (acl_text_len != NULL)
		*acl_text_len = strlen(acl->acl_text);
	return (0);
}